

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

Amount __thiscall cfd::TransactionContext::GetFeeAmount(TransactionContext *this)

{
  bool bVar1;
  uint32_t vout;
  undefined8 uVar2;
  UtxoData *this_00;
  undefined8 extraout_RDX;
  long in_RDI;
  Amount AVar3;
  Amount result;
  TxOut *txout_ref;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *__range1_1;
  Amount output;
  OutPoint outpoint;
  TxIn *txin_ref;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range1;
  UtxoData utxo;
  Amount input;
  string *in_stack_fffffffffffff920;
  CfdError in_stack_fffffffffffff92c;
  CfdException *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  UtxoData *in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff989;
  Amount local_670;
  int64_t local_660;
  undefined1 local_658;
  int64_t local_650;
  undefined1 local_648;
  Amount local_640;
  AbstractTxOut *local_630;
  __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
  local_628;
  __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
  local_620;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *local_618;
  Amount local_610;
  int64_t local_600;
  undefined1 local_5f8;
  undefined1 local_5ea;
  allocator local_5e9;
  string local_5e8 [48];
  Txid local_5b8;
  OutPoint local_598;
  AbstractTxIn *local_570;
  __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_568;
  __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_560;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *local_558;
  Amount local_2f0 [44];
  Amount local_28;
  Amount local_10;
  
  core::Amount::Amount(&local_28);
  UtxoData::UtxoData(in_stack_fffffffffffff980);
  local_558 = (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)(in_RDI + 0x10);
  local_560._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin(local_558);
  local_568._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end(local_558);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_560,&local_568);
    if (!bVar1) {
      core::Amount::Amount(&local_610);
      local_618 = (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)(in_RDI + 0x28);
      local_620._M_current =
           (TxOut *)std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::begin
                              (local_618);
      local_628._M_current =
           (TxOut *)std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::end(local_618)
      ;
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&local_620,&local_628);
        if (!bVar1) break;
        local_630 = &__gnu_cxx::
                     __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
                     ::operator*(&local_620)->super_AbstractTxOut;
        AVar3 = core::AbstractTxOut::GetValue(local_630);
        local_650 = AVar3.amount_;
        local_648 = AVar3.ignore_check_;
        local_640.amount_ = local_650;
        local_640.ignore_check_ = (bool)local_648;
        AVar3 = core::Amount::operator+=(&local_610,&local_640);
        local_660 = AVar3.amount_;
        local_658 = AVar3.ignore_check_;
        __gnu_cxx::
        __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
        ::operator++(&local_620);
      }
      AVar3 = core::operator-(&local_28,&local_610);
      local_670.amount_ = AVar3.amount_;
      local_670.ignore_check_ = AVar3.ignore_check_;
      this_00 = (UtxoData *)core::Amount::GetSatoshiValue(&local_670);
      if ((long)this_00 < 0) {
        core::Amount::Amount(&local_10);
      }
      else {
        local_10.amount_ = local_670.amount_;
        local_10._9_7_ = local_670._9_7_;
        local_10.ignore_check_ = local_670.ignore_check_;
      }
      UtxoData::~UtxoData(this_00);
      AVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      AVar3.ignore_check_ = local_10.ignore_check_;
      AVar3.amount_ = local_10.amount_;
      return AVar3;
    }
    local_570 = &__gnu_cxx::
                 __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                 ::operator*(&local_560)->super_AbstractTxIn;
    core::AbstractTxIn::GetTxid(&local_5b8,local_570);
    vout = core::AbstractTxIn::GetVout(local_570);
    core::OutPoint::OutPoint(&local_598,&local_5b8,vout);
    core::Txid::~Txid((Txid *)0x539bf6);
    bVar1 = IsFindUtxoMap((TransactionContext *)
                          CONCAT71(in_stack_fffffffffffff989,in_stack_fffffffffffff988),
                          (OutPoint *)in_stack_fffffffffffff980,
                          (UtxoData *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978))
    ;
    if (!bVar1) break;
    AVar3 = core::Amount::operator+=(&local_28,local_2f0);
    local_600 = AVar3.amount_;
    local_5f8 = AVar3.ignore_check_;
    core::OutPoint::~OutPoint((OutPoint *)0x539d9f);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
    ::operator++(&local_560);
  }
  local_5ea = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"Utxo is not found. GetFeeAmount fail.",&local_5e9);
  core::CfdException::CfdException
            (in_stack_fffffffffffff930,in_stack_fffffffffffff92c,in_stack_fffffffffffff920);
  local_5ea = 0;
  __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Amount TransactionContext::GetFeeAmount() const {
  Amount input;
  UtxoData utxo;
  for (const auto& txin_ref : vin_) {
    OutPoint outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. GetFeeAmount fail.");
    }
    input += utxo.amount;
  }

  Amount output;
  for (const auto& txout_ref : vout_) {
    output += txout_ref.GetValue();
  }
  Amount result = input - output;
  if (result.GetSatoshiValue() < 0) {
    return Amount();
  }
  return result;
}